

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_3dmidtex.cpp
# Opt level: O2

bool P_GetMidTexturePosition(line_t_conflict *line,int sideno,double *ptextop,double *ptexbot)

{
  double dVar1;
  FTextureID texnum;
  side_t *psVar2;
  FTexture *pFVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  
  if ((line->sidedef[0] != (side_t *)0x0) && (line->sidedef[1] != (side_t *)0x0)) {
    psVar2 = line->sidedef[sideno];
    texnum.texnum = psVar2->textures[1].texture.texnum;
    if (0 < texnum.texnum) {
      pFVar3 = FTextureManager::operator()(&TexMan,texnum,false);
      if (pFVar3 == (FTexture *)0x0) {
        return false;
      }
      dVar5 = ABS(psVar2->textures[1].yScale) * (pFVar3->Scale).Y;
      dVar4 = psVar2->textures[1].yOffset;
      if (((dVar5 != 1.0) || (NAN(dVar5))) && ((pFVar3->field_0x31 & 4) == 0)) {
        dVar4 = dVar4 / dVar5;
      }
      dVar5 = (double)pFVar3->Height / dVar5;
      if ((line->flags & 0x10) == 0) {
        dVar6 = line->frontsector->planes[1].TexZ;
        dVar1 = line->backsector->planes[1].TexZ;
        if (dVar1 <= dVar6) {
          dVar6 = dVar1;
        }
        *ptextop = dVar4 + dVar6;
        *ptexbot = (dVar4 + dVar6) - dVar5;
      }
      else {
        dVar6 = line->frontsector->planes[0].TexZ;
        dVar1 = line->backsector->planes[0].TexZ;
        if (dVar6 <= dVar1) {
          dVar6 = dVar1;
        }
        *ptexbot = dVar4 + dVar6;
        *ptextop = dVar5 + dVar4 + dVar6;
      }
      return true;
    }
  }
  return false;
}

Assistant:

bool P_GetMidTexturePosition(const line_t *line, int sideno, double *ptextop, double *ptexbot)
{
	if (line->sidedef[0]==NULL || line->sidedef[1]==NULL) return false;
	
	side_t *side = line->sidedef[sideno];
	FTextureID texnum = side->GetTexture(side_t::mid);
	if (!texnum.isValid()) return false;
	FTexture * tex= TexMan(texnum);
	if (!tex) return false;

	double totalscale = fabs(side->GetTextureYScale(side_t::mid)) * tex->GetScaleY();
	double y_offset = side->GetTextureYOffset(side_t::mid);
	double textureheight = tex->GetHeight() / totalscale;
	if (totalscale != 1. && !tex->bWorldPanning)
	{ 
		y_offset /= totalscale;
	}

	if(line->flags & ML_DONTPEGBOTTOM)
	{
		*ptexbot = y_offset +
			MAX(line->frontsector->GetPlaneTexZ(sector_t::floor), line->backsector->GetPlaneTexZ(sector_t::floor));

		*ptextop = *ptexbot + textureheight;
	}
	else
	{
		*ptextop = y_offset +
		   MIN(line->frontsector->GetPlaneTexZ(sector_t::ceiling), line->backsector->GetPlaneTexZ(sector_t::ceiling));
		
		*ptexbot = *ptextop - textureheight;
	}
	return true;
}